

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

void __thiscall wasm::TranslateToFuzzReader::recombine(TranslateToFuzzReader *this,Function *func)

{
  Random *this_00;
  size_t *psVar1;
  Expression **ppEVar2;
  _Hash_node_base *p_Var3;
  uint32_t uVar4;
  value_type *ppEVar5;
  _Hash_node_base *p_Var6;
  _Hash_node_base *p_Var7;
  _Hash_node_base *p_Var8;
  pointer pTVar9;
  ulong uVar10;
  undefined1 auStack_268 [8];
  Scanner scanner;
  Modder modder;
  
  this_00 = &this->random;
  uVar4 = Random::upTo(this_00,2);
  if (uVar4 != 0) {
    scanner.parent =
         (TranslateToFuzzReader *)&scanner.exprsByType.Map._M_h._M_rehash_policy._M_next_resize;
    auStack_268 = (undefined1  [8])0x0;
    scanner.super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
    super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.replacep =
         (Expression **)0x0;
    scanner.super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
    super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.stack.fixed._M_elems[9].
    currp = (Expression **)0x0;
    scanner.super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
    super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    scanner.super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
    super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    scanner.super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
    super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    scanner.super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
    super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.currFunction =
         (Function *)0x0;
    scanner.exprsByType.Map._M_h._M_buckets = (__buckets_ptr)0x1;
    scanner.exprsByType.Map._M_h._M_bucket_count = 0;
    scanner.exprsByType.Map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    scanner.exprsByType.Map._M_h._M_element_count._0_4_ = 0x3f800000;
    scanner.exprsByType.Map._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    scanner.exprsByType.Map._M_h._M_rehash_policy._4_4_ = 0;
    scanner.exprsByType.Map._M_h._M_rehash_policy._M_next_resize = 0;
    scanner.exprsByType.Map._M_h._M_single_bucket =
         (__node_base_ptr)&scanner.exprsByType.Map._M_h._M_single_bucket;
    scanner.exprsByType.List.
    super__List_base<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    scanner.super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
    super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.currModule =
         (Module *)this;
    scanner.exprsByType.List.
    super__List_base<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next =
         (_List_node_base *)scanner.exprsByType.Map._M_h._M_single_bucket;
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)auStack_268,
               PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::scan,&func->body
              );
    if (((long)scanner.super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
               super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.stack.flexible.
               super__Vector_base<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_start -
         (long)scanner.super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
               super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.stack.fixed.
               _M_elems[9].currp >> 4) +
        (long)scanner.super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
              super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.replacep != 0) {
      do {
        if ((pointer)scanner.
                     super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                     super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.stack.
                     fixed._M_elems[9].currp ==
            scanner.super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
            super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.stack.flexible.
            super__Vector_base<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          if (scanner.super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
              super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.replacep ==
              (Expression **)0x0) {
            __assert_fail("usedFixed > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                          ,0x7e,
                          "T &wasm::SmallVector<wasm::Walker<Scanner, wasm::UnifiedExpressionVisitor<Scanner>>::Task, 10>::back() [T = wasm::Walker<Scanner, wasm::UnifiedExpressionVisitor<Scanner>>::Task, N = 10]"
                         );
          }
          pTVar9 = (pointer)(&(&scanner)[-1].exprsByType.List.
                              super__List_base<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                              ._M_impl._M_node._M_size +
                            (long)scanner.
                                  super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>
                                  .
                                  super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>
                                  .replacep * 2);
        }
        else {
          pTVar9 = scanner.super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>
                   .super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.stack.
                   flexible.
                   super__Vector_base<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task>_>
                   ._M_impl.super__Vector_impl_data._M_start + -1;
        }
        ppEVar2 = pTVar9->currp;
        if ((pointer)scanner.
                     super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                     super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.stack.
                     fixed._M_elems[9].currp ==
            scanner.super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
            super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.stack.flexible.
            super__Vector_base<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          if (scanner.super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
              super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.replacep ==
              (Expression **)0x0) {
            __assert_fail("usedFixed > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                          ,0x75,
                          "void wasm::SmallVector<wasm::Walker<Scanner, wasm::UnifiedExpressionVisitor<Scanner>>::Task, 10>::pop_back() [T = wasm::Walker<Scanner, wasm::UnifiedExpressionVisitor<Scanner>>::Task, N = 10]"
                         );
          }
          scanner.super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
          super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.replacep =
               (Expression **)
               ((long)scanner.
                      super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                      super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.replacep
               + -1);
        }
        else {
          scanner.super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
          super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start =
               scanner.super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
               super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.stack.flexible.
               super__Vector_base<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_start + -1;
        }
        auStack_268 = (undefined1  [8])ppEVar2;
        if (*ppEVar2 == (Expression *)0x0) {
          __assert_fail("*task.currp",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                        ,0x132,
                        "void wasm::Walker<Scanner, wasm::UnifiedExpressionVisitor<Scanner>>::walk(Expression *&) [SubType = Scanner, VisitorType = wasm::UnifiedExpressionVisitor<Scanner>]"
                       );
        }
        (*pTVar9->func)((Scanner *)auStack_268,ppEVar2);
      } while (((long)scanner.
                      super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                      super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.stack.
                      flexible.
                      super__Vector_base<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task>_>
                      ._M_impl.super__Vector_impl_data._M_start -
                (long)scanner.
                      super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                      super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.stack.
                      fixed._M_elems[9].currp >> 4) +
               (long)scanner.
                     super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                     super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.replacep
               != 0);
    }
    if (scanner.exprsByType.Map._M_h._M_single_bucket !=
        (__node_base_ptr)&scanner.exprsByType.Map._M_h._M_single_bucket) {
      psVar1 = &scanner.exprsByType.List.
                super__List_base<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                ._M_impl._M_node._M_size;
      p_Var7 = scanner.exprsByType.Map._M_h._M_single_bucket;
      do {
        uVar4 = Random::upTo(this_00,2);
        if (uVar4 != 0) {
          scanner.exprsByType.List.
          super__List_base<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
          ._M_impl._M_node._M_size = 0;
          modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
          super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.replacep =
               (Expression **)0x0;
          uVar4 = Random::upTo(this_00,(uint32_t)
                                       ((ulong)((long)p_Var7[4]._M_nxt - (long)p_Var7[3]._M_nxt) >>
                                       3));
          uVar4 = Random::upTo(this_00,uVar4);
          if (uVar4 != 0) {
            uVar10 = (ulong)uVar4;
            do {
              ppEVar5 = Random::
                        pick<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                                  (this_00,(vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                            *)(p_Var7 + 3));
              if (modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
                  super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.replacep ==
                  (Expression **)0x0) {
                std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
                _M_realloc_insert<wasm::Expression*const&>
                          ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)psVar1,
                           (iterator)0x0,ppEVar5);
              }
              else {
                *modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
                 super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.replacep =
                     *ppEVar5;
                modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
                super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.replacep =
                     modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
                     super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.replacep +
                     1;
              }
              uVar10 = uVar10 - 1;
            } while (uVar10 != 0);
          }
          if ((Expression **)
              scanner.exprsByType.List.
              super__List_base<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
              ._M_impl._M_node._M_size ==
              modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
              super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.replacep) {
            ppEVar5 = Random::pick<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                                (this_00,(vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                          *)(p_Var7 + 3));
            if (modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
                super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.replacep ==
                (Expression **)0x0) {
              std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
              _M_realloc_insert<wasm::Expression*const&>
                        ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)psVar1,
                         (iterator)0x0,ppEVar5);
            }
            else {
              *modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
               super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.replacep =
                   *ppEVar5;
              modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
              super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.replacep =
                   modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
                   super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.replacep + 1;
            }
          }
          p_Var8 = p_Var7[3]._M_nxt;
          p_Var3 = p_Var7[5]._M_nxt;
          *(undefined4 *)&p_Var7[3]._M_nxt =
               (undefined4)
               scanner.exprsByType.List.
               super__List_base<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
               ._M_impl._M_node._M_size;
          *(undefined4 *)((long)&p_Var7[3]._M_nxt + 4) =
               scanner.exprsByType.List.
               super__List_base<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
               ._M_impl._M_node._M_size._4_4_;
          *(undefined4 *)&p_Var7[4]._M_nxt =
               modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
               super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.replacep._0_4_;
          *(undefined4 *)((long)&p_Var7[4]._M_nxt + 4) =
               modder.super_PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.
               super_Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>.replacep._4_4_;
          p_Var7[5]._M_nxt = (_Hash_node_base *)0x0;
          scanner.exprsByType.List.
          super__List_base<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
          ._M_impl._M_node._M_size = (size_t)p_Var8;
          if (p_Var8 != (_Hash_node_base *)0x0) {
            operator_delete(p_Var8,(long)p_Var3 - (long)p_Var8);
          }
        }
        p_Var7 = p_Var7->_M_nxt;
      } while (p_Var7 != (_Hash_node_base *)&scanner.exprsByType.Map._M_h._M_single_bucket);
    }
    if (scanner.exprsByType.Map._M_h._M_single_bucket !=
        (__node_base_ptr)&scanner.exprsByType.Map._M_h._M_single_bucket) {
      psVar1 = &scanner.exprsByType.List.
                super__List_base<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                ._M_impl._M_node._M_size;
      p_Var7 = scanner.exprsByType.Map._M_h._M_single_bucket;
      do {
        p_Var3 = p_Var7[4]._M_nxt;
        for (p_Var8 = p_Var7[3]._M_nxt; p_Var8 != p_Var3; p_Var8 = p_Var8 + 1) {
          scanner.exprsByType.List.
          super__List_base<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
          ._M_impl._M_node._M_size = 0;
          p_Var6 = (_Hash_node_base *)
                   wasm::ExpressionManipulator::flexibleCopy(p_Var8->_M_nxt,this->wasm,psVar1);
          std::
          _Function_handler<wasm::Expression_*(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/manipulation.h:86:15)>
          ::_M_manager((_Any_data *)psVar1,(_Any_data *)psVar1,__destroy_functor);
          p_Var8->_M_nxt = p_Var6;
        }
        p_Var7 = p_Var7->_M_nxt;
      } while (p_Var7 != (_Hash_node_base *)&scanner.exprsByType.Map._M_h._M_single_bucket);
    }
    scanner.exprsByType.List.
    super__List_base<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
    ._M_impl._M_node._M_size = 0;
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)
               &scanner.exprsByType.List.
                super__List_base<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                ._M_impl._M_node._M_size,
               PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::scan,&func->body);
    std::__cxx11::
    _List_base<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
    ::_M_clear((_List_base<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                *)&scanner.exprsByType.Map._M_h._M_single_bucket);
    std::
    _Hashtable<wasm::Type,_std::pair<const_wasm::Type,_std::_List_iterator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::_List_iterator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Type,_std::pair<const_wasm::Type,_std::_List_iterator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::_List_iterator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&scanner.parent);
    if (scanner.super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
        super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.stack.fixed._M_elems
        [9].currp != (Expression **)0x0) {
      operator_delete(scanner.
                      super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                      super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.stack.
                      fixed._M_elems[9].currp,
                      (long)scanner.
                            super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>
                            .super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                            stack.flexible.
                            super__Vector_base<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)scanner.
                            super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>
                            .super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                            stack.fixed._M_elems[9].currp);
    }
  }
  return;
}

Assistant:

void TranslateToFuzzReader::recombine(Function* func) {
  // Don't always do this.
  if (oneIn(2)) {
    return;
  }
  // First, scan and group all expressions by type.
  struct Scanner
    : public PostWalker<Scanner, UnifiedExpressionVisitor<Scanner>> {
    TranslateToFuzzReader& parent;
    // A map of all expressions, categorized by type.
    InsertOrderedMap<Type, std::vector<Expression*>> exprsByType;
    Scanner(TranslateToFuzzReader& parent) : parent(parent) {}

    void visitExpression(Expression* curr) {
      if (parent.canBeArbitrarilyReplaced(curr)) {
        for (auto type : getRelevantTypes(curr->type)) {
          exprsByType[type].push_back(curr);
        }
      }
    }

    std::vector<Type> getRelevantTypes(Type type) {
      // Given an expression of a type, we can replace not only other
      // expressions with the same type, but also supertypes - since then we'd
      // be replacing with a subtype, which is valid.
      if (!type.isRef()) {
        return {type};
      }

      std::vector<Type> ret;
      ret.push_back(type);

      if (type.isNonNullable()) {
        auto nullable = getRelevantTypes(type.with(Nullable));
        ret.insert(ret.end(), nullable.begin(), nullable.end());
      }
      if (type.isExact()) {
        auto inexact = getRelevantTypes(type.with(Inexact));
        ret.insert(ret.end(), inexact.begin(), inexact.end());
        // Do not consider exact references to supertypes.
        return ret;
      }

      for (auto heapType = type.getHeapType().getSuperType(); heapType;
           heapType = heapType->getSuperType()) {
        ret.push_back(type.with(*heapType));
      }

      return ret;
    }
  };
  Scanner scanner(*this);
  scanner.walk(func->body);
  // Potentially trim the list of possible picks, so replacements are more
  // likely to collide.
  for (auto& pair : scanner.exprsByType) {
    if (oneIn(2)) {
      continue;
    }
    auto& list = pair.second;
    std::vector<Expression*> trimmed;
    size_t num = upToSquared(list.size());
    for (size_t i = 0; i < num; i++) {
      trimmed.push_back(pick(list));
    }
    if (trimmed.empty()) {
      trimmed.push_back(pick(list));
    }
    list.swap(trimmed);
  }
  // Replace them with copies, to avoid a copy into one altering another copy
  for (auto& pair : scanner.exprsByType) {
    for (auto*& item : pair.second) {
      item = ExpressionManipulator::copy(item, wasm);
    }
  }
  // Second, with some probability replace an item with another item having
  // a proper type. (This is not always valid due to nesting of labels, but
  // we'll fix that up later.)
  struct Modder : public PostWalker<Modder, UnifiedExpressionVisitor<Modder>> {
    Module& wasm;
    Scanner& scanner;
    TranslateToFuzzReader& parent;

    Modder(Module& wasm, Scanner& scanner, TranslateToFuzzReader& parent)
      : wasm(wasm), scanner(scanner), parent(parent) {}

    void visitExpression(Expression* curr) {
      if (parent.oneIn(10) && parent.canBeArbitrarilyReplaced(curr)) {
        // Replace it!
        auto& candidates = scanner.exprsByType[curr->type];
        assert(!candidates.empty()); // this expression itself must be there
        auto* rep = parent.pick(candidates);
        replaceCurrent(ExpressionManipulator::copy(rep, wasm));
      }
    }
  };
  Modder modder(wasm, scanner, *this);
  modder.walk(func->body);
  // TODO: A specific form of recombination we should perhaps do more often is
  //       to recombine among an expression's children, and in particular to
  //       reorder them.
}